

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

int ShCompile(ShHandle handle,char **shaderStrings,int numStrings,int *inputLengths,
             EShOptimizationLevel optLevel,TBuiltInResource *resources,int param_7,
             int defaultVersion,bool forwardCompatible,EShMessages messages,char *shaderFileName)

{
  bool bVar1;
  int iVar2;
  EShLanguage l;
  uint uVar3;
  EProfile EVar4;
  TCompiler *this;
  undefined4 extraout_var;
  TIntermNode *pTVar5;
  TPoolAllocator *this_00;
  allocator<char> local_899;
  string local_898;
  byte local_871;
  bool success;
  ForbidIncluder includer;
  TIntermediate intermediate;
  TCompiler *compiler;
  TShHandleBase *base;
  bool forwardCompatible_local;
  TBuiltInResource *resources_local;
  EShOptimizationLevel optLevel_local;
  int *inputLengths_local;
  int numStrings_local;
  char **shaderStrings_local;
  ShHandle handle_local;
  
  if (handle == (ShHandle)0x0) {
    handle_local._4_4_ = 0;
  }
  else {
    this = (TCompiler *)(**(code **)(*handle + 0x10))();
    if (this == (TCompiler *)0x0) {
      handle_local._4_4_ = 0;
    }
    else {
      iVar2 = (*(this->super_TShHandleBase)._vptr_TShHandleBase[5])();
      glslang::SetThreadPoolAllocator((TPoolAllocator *)CONCAT44(extraout_var,iVar2));
      glslang::TInfoSinkBase::erase(&this->infoSink->info);
      glslang::TInfoSinkBase::erase(&this->infoSink->debug);
      glslang::TInfoSinkBase::setShaderFileName(&this->infoSink->info,shaderFileName);
      glslang::TInfoSinkBase::setShaderFileName(&this->infoSink->debug,shaderFileName);
      l = TCompiler::getLanguage(this);
      glslang::TIntermediate::TIntermediate((TIntermediate *)&includer,l,0,ENoProfile);
      glslang::TShader::ForbidIncluder::ForbidIncluder((ForbidIncluder *)&stack0xfffffffffffff790);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_898,"",&local_899);
      bVar1 = anon_unknown.dwarf_8f1b29::CompileDeferred
                        (this,shaderStrings,numStrings,inputLengths,(char **)0x0,"",optLevel,
                         resources,defaultVersion,ENoProfile,false,0,forwardCompatible,messages,
                         (TIntermediate *)&includer,(Includer *)&stack0xfffffffffffff790,&local_898,
                         (TEnvironment *)0x0,false);
      std::__cxx11::string::~string((string *)&local_898);
      std::allocator<char>::~allocator(&local_899);
      local_871 = bVar1;
      if (((bVar1) &&
          (pTVar5 = glslang::TIntermediate::getTreeRoot((TIntermediate *)&includer),
          pTVar5 != (TIntermNode *)0x0)) && (optLevel != EShOptNoGeneration)) {
        pTVar5 = glslang::TIntermediate::getTreeRoot((TIntermediate *)&includer);
        uVar3 = glslang::TIntermediate::getVersion((TIntermediate *)&includer);
        EVar4 = glslang::TIntermediate::getProfile((TIntermediate *)&includer);
        iVar2 = (*(this->super_TShHandleBase)._vptr_TShHandleBase[7])
                          (this,pTVar5,(ulong)uVar3,(ulong)EVar4);
        local_871 = (byte)iVar2 & 1;
      }
      glslang::TIntermediate::removeTree((TIntermediate *)&includer);
      this_00 = glslang::GetThreadPoolAllocator();
      glslang::TPoolAllocator::pop(this_00);
      handle_local._4_4_ = (uint)((local_871 & 1) != 0);
      glslang::TShader::ForbidIncluder::~ForbidIncluder((ForbidIncluder *)&stack0xfffffffffffff790);
      glslang::TIntermediate::~TIntermediate((TIntermediate *)&includer);
    }
  }
  return handle_local._4_4_;
}

Assistant:

int ShCompile(
    const ShHandle handle,
    const char* const shaderStrings[],
    const int numStrings,
    const int* inputLengths,
    const EShOptimizationLevel optLevel,
    const TBuiltInResource* resources,
    int /*debugOptions*/,
    int defaultVersion,        // use 100 for ES environment, 110 for desktop
    bool forwardCompatible,    // give errors for use of deprecated features
    EShMessages messages,       // warnings/errors/AST; things to print out,
    const char *shaderFileName // the filename
    )
{
    // Map the generic handle to the C++ object
    if (handle == nullptr)
        return 0;

    TShHandleBase* base = reinterpret_cast<TShHandleBase*>(handle);
    TCompiler* compiler = base->getAsCompiler();
    if (compiler == nullptr)
        return 0;

    SetThreadPoolAllocator(compiler->getPool());

    compiler->infoSink.info.erase();
    compiler->infoSink.debug.erase();
    compiler->infoSink.info.setShaderFileName(shaderFileName);
    compiler->infoSink.debug.setShaderFileName(shaderFileName);


    TIntermediate intermediate(compiler->getLanguage());
    TShader::ForbidIncluder includer;
    bool success = CompileDeferred(compiler, shaderStrings, numStrings, inputLengths, nullptr,
                                   "", optLevel, resources, defaultVersion, ENoProfile, false, 0,
                                   forwardCompatible, messages, intermediate, includer);

    //
    // Call the machine dependent compiler
    //
    if (success && intermediate.getTreeRoot() && optLevel != EShOptNoGeneration)
        success = compiler->compile(intermediate.getTreeRoot(), intermediate.getVersion(), intermediate.getProfile());

    intermediate.removeTree();

    // Throw away all the temporary memory used by the compilation process.
    // The push was done in the CompileDeferred() call above.
    GetThreadPoolAllocator().pop();

    return success ? 1 : 0;
}